

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_ue(bitstream *str,uint32_t *val)

{
  int iVar1;
  uint32_t local_28;
  int local_24;
  uint32_t tmp;
  int lzb;
  uint32_t *val_local;
  bitstream *str_local;
  
  local_24 = 0;
  iVar1 = local_24;
  _tmp = val;
  val_local = &str->dir;
  if (str->dir == VS_ENCODE) {
    local_28 = 0;
    if (*val == 0xffffffff) {
      fprintf(_stderr,"Exp-Golomb number larger than 2^32-2\n");
      str_local._4_4_ = 1;
    }
    else {
      while ((1 << ((char)local_24 + 1U & 0x1f)) - 1U <= *_tmp) {
        iVar1 = vs_u((bitstream *)val_local,&local_28,1);
        if (iVar1 != 0) {
          return 1;
        }
        local_24 = local_24 + 1;
      }
      local_28 = 1;
      iVar1 = vs_u((bitstream *)val_local,&local_28,1);
      if (iVar1 == 0) {
        local_28 = *_tmp - ((1 << ((byte)local_24 & 0x1f)) + -1);
        iVar1 = vs_u((bitstream *)val_local,&local_28,local_24);
        if (iVar1 == 0) {
          str_local._4_4_ = 0;
        }
        else {
          str_local._4_4_ = 1;
        }
      }
      else {
        str_local._4_4_ = 1;
      }
    }
  }
  else {
    do {
      local_24 = iVar1;
      iVar1 = vs_u((bitstream *)val_local,&local_28,1);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = local_24 + 1;
    } while (local_28 == 0);
    if (local_24 < 0x20) {
      iVar1 = vs_u((bitstream *)val_local,&local_28,local_24);
      if (iVar1 == 0) {
        *_tmp = (local_28 + (1 << ((byte)local_24 & 0x1f))) - 1;
        str_local._4_4_ = 0;
      }
      else {
        str_local._4_4_ = 1;
      }
    }
    else {
      fprintf(_stderr,"Exp-Golomb number larger than 2^32-2\n");
      str_local._4_4_ = 1;
    }
  }
  return str_local._4_4_;
}

Assistant:

int vs_ue(struct bitstream *str, uint32_t *val) {
	int lzb = 0;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		tmp = 0;
		if (*val >= (uint32_t)0xffffffff) {
			fprintf (stderr, "Exp-Golomb number larger than 2^32-2\n");
			return 1;
		}
		while (*val >= (uint32_t)(1u << (lzb + 1)) - 1) {
			if (vs_u(str, &tmp, 1))
				return 1;
			lzb++;
		}
		tmp = 1;
		if (vs_u(str, &tmp, 1))
			return 1;
		tmp = *val - ((1 << lzb) - 1);
		if (vs_u(str, &tmp, lzb))
			return 1;
		return 0;
	} else {
		do {
			if (vs_u(str, &tmp, 1))
				return 1;
			lzb++;
		} while (!tmp);
		lzb--;
		if (lzb > 31) {
			fprintf (stderr, "Exp-Golomb number larger than 2^32-2\n");
			return 1;
		}
		if (vs_u(str, &tmp, lzb))
			return 1;
		*val = tmp + (1u << lzb) - 1;
		return 0;
	}
}